

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void Fl::enable_im(void)

{
  int iVar1;
  Fl_Window *this;
  Window xid;
  Fl_Window *win;
  
  this = first_window();
  if ((this != (Fl_Window *)0x0) && (iVar1 = Fl_Window::shown(this), iVar1 != 0)) {
    xid = fl_xid(this);
    fl_xim_activate(xid);
    XSetICFocus(fl_xim_ic);
    return;
  }
  fl_new_ic();
  return;
}

Assistant:

void Fl::enable_im() {
  Fl_Window *win;

  win = Fl::first_window();
  if (win && win->shown()) {
    fl_xim_activate(fl_xid(win));
    XSetICFocus(fl_xim_ic);
  } else {
    fl_new_ic();
  }
}